

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<signed_char>
          (OutOfRangeException *this,string *msg,char params)

{
  string local_30;
  
  Exception::ConstructMessage<signed_char>(&local_30,msg,params);
  duckdb::OutOfRangeException::OutOfRangeException(this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}